

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O0

void __thiscall Fluid::reset_grid(Fluid *this)

{
  Fluid *this_local;
  
  ssbo_barrier(this);
  gfx::Program::use(&this->reset_grid_program);
  set_common_uniforms(this,&this->reset_grid_program);
  gfx::Program::validate(&this->reset_grid_program);
  (*glad_glDispatchCompute)
            ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
             (this->grid_dimensions).field_2.z);
  gfx::Program::disuse(&this->reset_grid_program);
  return;
}

Assistant:

void reset_grid() {
        ssbo_barrier();
        reset_grid_program.use();
        set_common_uniforms(reset_grid_program);
        reset_grid_program.validate();
        glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);
        reset_grid_program.disuse();
    }